

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

QByteArray * __thiscall Parser::lexem(Parser *this)

{
  QList<Symbol> *in_RDI;
  Symbol *in_stack_ffffffffffffffd8;
  
  QList<Symbol>::at(in_RDI,(qsizetype)in_stack_ffffffffffffffd8);
  Symbol::lexem(in_stack_ffffffffffffffd8);
  return (QByteArray *)in_RDI;
}

Assistant:

inline QByteArray lexem() { return symbols.at(index-1).lexem();}